

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeInertiaStiffnessMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixNM<double,_12,_12> *Ki,
          ChVector<double> *mWvel_A,ChVector<double> *mWacc_A,ChVector<double> *mXacc_A,
          ChVector<double> *mWvel_B,ChVector<double> *mWacc_B,ChVector<double> *mXacc_B)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  ChMatrixNM<double,_6,_6> Ki_B;
  ChMatrixNM<double,_6,_6> Ki_A;
  double local_2a0;
  double dStack_298;
  double local_290;
  double dStack_288;
  double local_280;
  double dStack_278;
  double local_270;
  double dStack_268;
  double local_260;
  double dStack_258;
  double local_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double local_230;
  double dStack_228;
  double local_220;
  double dStack_218;
  double local_210;
  double dStack_208;
  double local_200;
  double dStack_1f8;
  double local_1f0;
  double dStack_1e8;
  double local_1e0;
  double dStack_1d8;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  double dStack_1b8;
  double local_1b0;
  double dStack_1a8;
  double local_1a0;
  double dStack_198;
  double local_190;
  double dStack_188;
  double local_180;
  double dStack_178;
  double local_170;
  double dStack_168;
  double local_160;
  double dStack_158;
  double local_150;
  double dStack_148;
  double local_140;
  double dStack_138;
  double local_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double local_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double local_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  double dStack_98;
  double local_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  double local_70;
  double dStack_68;
  
  memset(Ki,0,0x480);
  bVar1 = this->compute_inertia_stiffness_matrix;
  if (bVar1 != false) {
    bVar2 = this->compute_inertia_damping_matrix;
    peVar4 = (this->sectionA).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_inertia_damping_matrix = bVar2;
    (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_inertia_stiffness_matrix = bVar1;
    bVar3 = this->compute_Ri_Ki_by_num_diff;
    (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_Ri_Ki_by_num_diff = bVar3;
    peVar5 = (this->sectionB).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_inertia_damping_matrix = bVar2;
    (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_inertia_stiffness_matrix = bVar1;
    (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.
    super_ChBeamSectionEuler.compute_Ri_Ki_by_num_diff = bVar3;
    (**(code **)((long)(peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x78))
              (peVar4,&local_180,mWvel_A,mWacc_A,mXacc_A);
    peVar4 = (this->sectionB).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)((long)(peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x78))
              (peVar4,&local_2a0,mWvel_B,mWacc_B,mXacc_B);
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0]
         = local_180;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[1]
         = dStack_178;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[2]
         = local_170;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[3]
         = dStack_168;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[4]
         = local_160;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[5]
         = dStack_158;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0xc] = local_150;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0xd] = dStack_148;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0xe] = local_140;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0xf] = dStack_138;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x10] = local_130;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x11] = dStack_128;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x18] = local_120;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x19] = dStack_118;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x1a] = local_110;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x1b] = dStack_108;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x1c] = local_100;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x1d] = dStack_f8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x24] = local_f0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x25] = dStack_e8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x26] = local_e0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x27] = dStack_d8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x28] = local_d0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x29] = dStack_c8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x30] = local_c0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x31] = dStack_b8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x32] = local_b0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x33] = dStack_a8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x34] = local_a0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x35] = dStack_98;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x3c] = local_90;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x3d] = dStack_88;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x3e] = local_80;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x3f] = dStack_78;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x40] = local_70;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x41] = dStack_68;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x4e] = local_2a0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x4f] = dStack_298;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x50] = local_290;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x51] = dStack_288;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x52] = local_280;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x53] = dStack_278;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x5a] = local_270;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x5b] = dStack_268;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x5c] = local_260;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x5d] = dStack_258;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x5e] = local_250;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x5f] = dStack_248;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x66] = local_240;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x67] = dStack_238;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x68] = local_230;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x69] = dStack_228;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x6a] = local_220;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x6b] = dStack_218;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x72] = local_210;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x73] = dStack_208;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x74] = local_200;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x75] = dStack_1f8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x76] = local_1f0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x77] = dStack_1e8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x7e] = local_1e0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x7f] = dStack_1d8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x80] = local_1d0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x81] = dStack_1c8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x82] = local_1c0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x83] = dStack_1b8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x8a] = local_1b0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x8b] = dStack_1a8;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x8c] = local_1a0;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x8d] = dStack_198;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x8e] = local_190;
    (Ki->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
    [0x8f] = dStack_188;
  }
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeInertiaStiffnessMatrix(
    ChMatrixNM<double, 12, 12>& Ki,
    const ChVector<>& mWvel_A,  ///< current angular velocity of section of node A, in material frame
    const ChVector<>& mWacc_A,  ///< current angular acceleration of section of node A, in material frame
    const ChVector<>& mXacc_A,  ///< current acceleration of section of node A, in material frame)
    const ChVector<>& mWvel_B,  ///< current angular velocity of section of node B, in material frame
    const ChVector<>& mWacc_B,  ///< current angular acceleration of section of node B, in material frame
    const ChVector<>& mXacc_B   ///< current acceleration of section of node B, in material frame
) {
    Ki.setZero(12, 12);

    if (this->compute_inertia_stiffness_matrix == false)
        return;

    this->sectionA->compute_inertia_damping_matrix = this->compute_inertia_damping_matrix;
    this->sectionA->compute_inertia_stiffness_matrix = this->compute_inertia_stiffness_matrix;
    this->sectionA->compute_Ri_Ki_by_num_diff = this->compute_Ri_Ki_by_num_diff;

    this->sectionB->compute_inertia_damping_matrix = this->compute_inertia_damping_matrix;
    this->sectionB->compute_inertia_stiffness_matrix = this->compute_inertia_stiffness_matrix;
    this->sectionB->compute_Ri_Ki_by_num_diff = this->compute_Ri_Ki_by_num_diff;

    ChMatrixNM<double, 6, 6> Ki_A;
    ChMatrixNM<double, 6, 6> Ki_B;
    this->sectionA->ComputeInertiaStiffnessMatrix(Ki_A, mWvel_A, mWacc_A, mXacc_A);
    this->sectionB->ComputeInertiaStiffnessMatrix(Ki_B, mWvel_B, mWacc_B, mXacc_B);

    Ki.block<6, 6>(0, 0) = Ki_A;
    Ki.block<6, 6>(6, 6) = Ki_B;
}